

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRuleParser::parseUnicodeSet
          (CollationRuleParser *this,int32_t i,UnicodeSet *set,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  char16_t *pcVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  char16_t cVar7;
  long lVar8;
  uint i_00;
  bool bVar9;
  UnicodeString local_70;
  
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    i_00 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    i_00 = (int)sVar1 >> 5;
  }
  lVar8 = 0;
  iVar6 = 0;
  do {
    if ((long)(int)i_00 - (long)i == lVar8) {
      if (U_ZERO_ERROR < *errorCode) {
        return i_00;
      }
      *errorCode = U_INVALID_FORMAT_ERROR;
      pcVar4 = "unbalanced UnicodeSet pattern brackets";
      goto LAB_0023fa39;
    }
    cVar7 = L'\xffff';
    if ((uint)(i + (int)lVar8) < i_00) {
      pcVar3 = (char16_t *)((long)&pUVar2->fUnion + 2);
      if (((int)sVar1 & 2U) == 0) {
        pcVar3 = (pUVar2->fUnion).fFields.fArray;
      }
      cVar7 = pcVar3[i + lVar8];
    }
    if (cVar7 == L']') {
      iVar6 = iVar6 + -1;
      bVar9 = iVar6 != 0;
    }
    else {
      bVar9 = true;
      if (cVar7 == L'[') {
        iVar6 = iVar6 + 1;
      }
    }
    lVar8 = lVar8 + 1;
  } while (bVar9);
  UnicodeString::tempSubString(&local_70,pUVar2,i,(int32_t)lVar8);
  UnicodeSet::applyPattern(set,&local_70,errorCode);
  i_00 = i + (int32_t)lVar8;
  UnicodeString::~UnicodeString(&local_70);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = skipWhiteSpace(this,i_00);
    pUVar2 = this->rules;
    sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    if (i_00 < uVar5) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar3 = (pUVar2->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&pUVar2->fUnion + 2);
      }
      if (pcVar3[(int)i_00] == L']') {
        return i_00 + 1;
      }
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      pcVar4 = "missing option-terminating \']\' after UnicodeSet pattern";
LAB_0023fa39:
      this->errorReason = pcVar4;
      if (this->parseError != (UParseError *)0x0) {
        setErrorContext(this);
      }
    }
  }
  else {
    *errorCode = U_INVALID_FORMAT_ERROR;
    this->errorReason = "not a valid UnicodeSet pattern";
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
  return i_00;
}

Assistant:

int32_t
CollationRuleParser::parseUnicodeSet(int32_t i, UnicodeSet &set, UErrorCode &errorCode) {
    // Collect a UnicodeSet pattern between a balanced pair of [brackets].
    int32_t level = 0;
    int32_t j = i;
    for(;;) {
        if(j == rules->length()) {
            setParseError("unbalanced UnicodeSet pattern brackets", errorCode);
            return j;
        }
        UChar c = rules->charAt(j++);
        if(c == 0x5b) {  // '['
            ++level;
        } else if(c == 0x5d) {  // ']'
            if(--level == 0) { break; }
        }
    }
    set.applyPattern(rules->tempSubStringBetween(i, j), errorCode);
    if(U_FAILURE(errorCode)) {
        errorCode = U_ZERO_ERROR;
        setParseError("not a valid UnicodeSet pattern", errorCode);
        return j;
    }
    j = skipWhiteSpace(j);
    if(j == rules->length() || rules->charAt(j) != 0x5d) {
        setParseError("missing option-terminating ']' after UnicodeSet pattern", errorCode);
        return j;
    }
    return ++j;
}